

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void RadialFetchPlain<GradientBaseFP>::fetch
               (BlendType *buffer,BlendType *end,Operator *op,QSpanData *data,qreal det,
               qreal delta_det,qreal delta_delta_det,qreal b,qreal delta_b)

{
  long lVar1;
  double dVar2;
  long in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  Type TVar3;
  qreal w_1;
  qreal w;
  BlendType result_1;
  BlendType result;
  QGradientData *in_stack_ffffffffffffff58;
  double local_88;
  double local_78;
  double local_70;
  undefined8 *local_50;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_18;
  undefined8 uStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_70 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_88 = in_XMM3_Qa;
  local_78 = in_XMM1_Qa;
  local_50 = in_RDI;
  if ((*(byte *)(in_RDX + 0xa8) & 1) == 0) {
    while (local_50 < in_RSI) {
      TVar3 = GradientBaseFP::null();
      uStack_30 = TVar3._8_8_;
      local_38 = TVar3._0_8_;
      if (0.0 <= local_70) {
        qSqrt<double>(5.94836114878625e-317);
        TVar3 = GradientBaseFP::fetchSingle(in_stack_ffffffffffffff58,5.94838041734644e-317);
        uStack_30 = TVar3._8_8_;
        local_38 = TVar3._0_8_;
      }
      *local_50 = local_38;
      local_50[1] = uStack_30;
      local_70 = local_78 + local_70;
      local_78 = in_XMM2_Qa + local_78;
      local_50 = local_50 + 2;
    }
  }
  else {
    for (; local_50 < in_RSI; local_50 = local_50 + 2) {
      TVar3 = GradientBaseFP::null();
      uStack_10 = TVar3._8_8_;
      local_18 = TVar3._0_8_;
      if ((0.0 <= local_70) &&
         (dVar2 = qSqrt<double>(5.94820551810781e-317),
         0.0 <= *(double *)(in_RDX + 0x90) * (dVar2 - local_88) + *(double *)(in_RCX + 0xd8))) {
        TVar3 = GradientBaseFP::fetchSingle(in_stack_ffffffffffffff58,5.94824701962206e-317);
        uStack_10 = TVar3._8_8_;
        local_18 = TVar3._0_8_;
      }
      *local_50 = local_18;
      local_50[1] = uStack_10;
      local_70 = local_78 + local_70;
      local_78 = in_XMM2_Qa + local_78;
      local_88 = in_XMM4_Qa + local_88;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fetch(BlendType *buffer, BlendType *end,
                      const Operator *op, const QSpanData *data, qreal det,
                      qreal delta_det, qreal delta_delta_det, qreal b, qreal delta_b)
    {
        if (op->radial.extended) {
            while (buffer < end) {
                BlendType result = GradientBase::null();
                if (det >= 0) {
                    qreal w = qSqrt(det) - b;
                    if (data->gradient.radial.focal.radius + op->radial.dr * w >= 0)
                        result = GradientBase::fetchSingle(data->gradient, w);
                }

                *buffer = result;

                det += delta_det;
                delta_det += delta_delta_det;
                b += delta_b;

                ++buffer;
            }
        } else {
            while (buffer < end) {
                BlendType result = GradientBase::null();
                if (det >= 0) {
                    qreal w = qSqrt(det) - b;
                    result = GradientBase::fetchSingle(data->gradient, w);
                }

                *buffer++ = result;

                det += delta_det;
                delta_det += delta_delta_det;
                b += delta_b;
            }
        }
    }